

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O1

string * __thiscall
SQLite::Statement::getExpandedSQL_abi_cxx11_(string *__return_storage_ptr__,Statement *this)

{
  sqlite3_stmt *pStmt;
  char *p;
  allocator local_11;
  
  pStmt = getPreparedStatement(this);
  p = sqlite3_expanded_sql(pStmt);
  std::__cxx11::string::string((string *)__return_storage_ptr__,p,&local_11);
  sqlite3_free(p);
  return __return_storage_ptr__;
}

Assistant:

std::string Statement::getExpandedSQL() const {
    char* expanded = sqlite3_expanded_sql(getPreparedStatement());
    std::string expandedString(expanded);
    sqlite3_free(expanded);
    return expandedString;
}